

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O1

bool __thiscall
cmDependsC::WriteDependencies
          (cmDependsC *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *makeDepends,ostream *internalDepends)

{
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *this_00;
  char cVar1;
  _Base_ptr p_Var2;
  _Elt_pointer pUVar3;
  pointer pcVar4;
  value_type *pvVar5;
  string *psVar6;
  cmGlobalGenerator *pcVar7;
  cmLocalUnixMakefileGenerator3 *this_01;
  bool bVar8;
  BOM BVar9;
  const_iterator cVar10;
  _Base_ptr p_Var11;
  long *plVar12;
  iterator iVar13;
  iterator iVar14;
  iterator iVar15;
  mapped_type *this_02;
  ostream *poVar16;
  _Rb_tree_node_base *p_Var17;
  ulong *puVar18;
  _Rb_tree_header *p_Var19;
  UnscannedEntry *inc;
  value_type *__x;
  string *in_base;
  string fullName;
  UnscannedEntry current;
  string dir;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scanned;
  string obj_i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  string obj_m;
  int local_394;
  key_type local_390;
  ostream *local_370;
  string local_368;
  string local_348;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  undefined1 local_300 [32];
  _Base_ptr local_2e0;
  size_t local_2d8;
  cmDependsC *local_2d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2c8;
  ostream *local_2c0;
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *local_2b8;
  string local_2b0;
  _Base_ptr local_290;
  _Base_ptr local_288;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>_>
  *local_280;
  RegularExpression *local_278;
  _Base_ptr local_270;
  undefined1 local_268 [16];
  _Base_ptr local_258;
  _Rb_tree_node_base *local_250;
  _Rb_tree_node_base *local_248;
  size_t local_240;
  value_type local_238 [8];
  
  local_370 = makeDepends;
  local_2c0 = internalDepends;
  if (((sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     ((sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent == (_Base_ptr)0x0
     )) {
    local_238[0].FileName._M_dataplus._M_p = (pointer)&local_238[0].FileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"Cannot scan dependencies without a source file.","");
    cmSystemTools::Error(&local_238[0].FileName);
  }
  else {
    if (obj->_M_string_length != 0) {
      local_250 = (_Rb_tree_node_base *)(local_268 + 8);
      local_268._8_4_ = 0;
      local_258 = (_Base_ptr)0x0;
      local_240 = 0;
      local_248 = local_250;
      cmOutputConverter::MaybeRelativeToTopBinDir
                (&local_2b0,
                 &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                  super_cmLocalGenerator.super_cmOutputConverter,obj);
      if ((&this->ValidDeps->_M_t ==
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)0x0) ||
         (cVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::find(&this->ValidDeps->_M_t,&local_2b0),
         (_Rb_tree_header *)cVar10._M_node == &(this->ValidDeps->_M_t)._M_impl.super__Rb_tree_header
         )) {
        local_394 = (int)(sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        local_328 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     *)&this->Encountered;
        local_2d0 = this;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_328);
        p_Var11 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var19 = &(sources->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var11 != p_Var19) {
          this_00 = &local_2d0->Unscanned;
          do {
            local_238[0].FileName._M_dataplus._M_p = (pointer)&local_238[0].FileName.field_2;
            local_238[0].FileName._M_string_length = 0;
            local_238[0].FileName.field_2._M_allocated_capacity =
                 local_238[0].FileName.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_238[0].QuotedLocation._M_dataplus._M_p =
                 (pointer)&local_238[0].QuotedLocation.field_2;
            local_238[0].QuotedLocation._M_string_length = 0;
            local_238[0].QuotedLocation.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::_M_assign((string *)local_238);
            std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
            push_back(&this_00->c,local_238);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      (local_328,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var11 + 1));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0].QuotedLocation._M_dataplus._M_p !=
                &local_238[0].QuotedLocation.field_2) {
              operator_delete(local_238[0].QuotedLocation._M_dataplus._M_p,
                              CONCAT71(local_238[0].QuotedLocation.field_2._M_allocated_capacity.
                                       _1_7_,local_238[0].QuotedLocation.field_2._M_local_buf[0]) +
                              1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
              operator_delete(local_238[0].FileName._M_dataplus._M_p,
                              local_238[0].FileName.field_2._M_allocated_capacity + 1);
            }
            p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
          } while ((_Rb_tree_header *)p_Var11 != p_Var19);
        }
        this = local_2d0;
        local_300._24_8_ = local_300 + 8;
        local_300._8_4_ = _S_red;
        local_300._16_8_ = (_Base_ptr)0x0;
        local_2d8 = 0;
        local_2b8 = &local_2d0->Unscanned;
        local_2c8 = &local_2d0->HeaderLocationCache;
        local_290 = &(local_2d0->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_278 = &local_2d0->IncludeRegexComplain;
        local_280 = &local_2d0->FileCache;
        local_288 = &(local_2d0->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_270 = &(local_2d0->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_2e0 = (_Base_ptr)local_300._24_8_;
        do {
          pUVar3 = (this->Unscanned).c.
                   super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          if ((this->Unscanned).c.
              super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur == pUVar3) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_300);
            goto LAB_0055ff6a;
          }
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          pcVar4 = (pUVar3->FileName)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_368,pcVar4,pcVar4 + (pUVar3->FileName)._M_string_length);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          pcVar4 = (pUVar3->QuotedLocation)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_348,pcVar4,pcVar4 + (pUVar3->QuotedLocation)._M_string_length)
          ;
          std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
          pop_front(&local_2b8->c);
          local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
          local_390._M_string_length = 0;
          local_390.field_2._M_local_buf[0] = '\0';
          if ((0 < local_394) || (bVar8 = cmsys::SystemTools::FileIsFullPath(&local_368), bVar8)) {
            bVar8 = cmsys::SystemTools::FileExists(&local_368,true);
            if (bVar8) goto LAB_0055fb2d;
          }
          else if ((local_348._M_string_length == 0) ||
                  (bVar8 = cmsys::SystemTools::FileExists(&local_348,true), !bVar8)) {
            iVar15 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find(&local_2c8->_M_t,&local_368);
            if (iVar15._M_node == local_290) {
              psVar6 = (this->super_cmDepends).IncludePath.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (in_base = (this->super_cmDepends).IncludePath.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; in_base != psVar6;
                  in_base = in_base + 1) {
                while( true ) {
                  cmsys::SystemTools::CollapseFullPath(&local_238[0].FileName,&local_368,in_base);
                  bVar8 = cmsys::SystemTools::FileExists(&local_238[0].FileName,true);
                  if (!bVar8) break;
                  std::__cxx11::string::_M_assign((string *)&local_390);
                  this_02 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](local_2c8,&local_368);
                  std::__cxx11::string::operator=((string *)this_02,(string *)local_238);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
                    operator_delete(local_238[0].FileName._M_dataplus._M_p,
                                    local_238[0].FileName.field_2._M_allocated_capacity + 1);
                  }
                  in_base = in_base + 1;
                  if (bVar8 || in_base == psVar6) goto LAB_0055fb37;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
                  operator_delete(local_238[0].FileName._M_dataplus._M_p,
                                  local_238[0].FileName.field_2._M_allocated_capacity + 1);
                }
              }
            }
            else {
              std::__cxx11::string::_M_assign((string *)&local_390);
            }
          }
          else {
LAB_0055fb2d:
            std::__cxx11::string::_M_assign((string *)&local_390);
          }
LAB_0055fb37:
          if ((local_390._M_string_length == 0) &&
             (bVar8 = cmsys::RegularExpression::find
                                (local_278,local_368._M_dataplus._M_p,&local_278->regmatch), bVar8))
          {
            std::operator+(&local_320,"Cannot find file \"",&local_368);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_320);
            local_238[0].FileName._M_dataplus._M_p = (pointer)&local_238[0].FileName.field_2;
            puVar18 = (ulong *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar18) {
              local_238[0].FileName.field_2._0_8_ = *puVar18;
              local_238[0].FileName.field_2._8_8_ = plVar12[3];
            }
            else {
              local_238[0].FileName.field_2._0_8_ = *puVar18;
              local_238[0].FileName._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_238[0].FileName._M_string_length = plVar12[1];
            *plVar12 = (long)puVar18;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            cmSystemTools::Error(&local_238[0].FileName);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
              operator_delete(local_238[0].FileName._M_dataplus._M_p,
                              local_238[0].FileName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_dataplus._M_p != &local_320.field_2) {
              operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1
                             );
            }
            bVar8 = false;
          }
          else {
            if ((local_390._M_string_length != 0) &&
               (iVar13 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_300,&local_390),
               iVar13._M_node == (_Base_ptr)(local_300 + 8))) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_300,&local_390);
              iVar14 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>_>
                       ::find(&local_280->_M_t,&local_390);
              if (iVar14._M_node == local_288) {
                std::ifstream::ifstream(local_238,local_390._M_dataplus._M_p,_S_in);
                if (((*(byte *)((long)&local_238[0].QuotedLocation._M_dataplus._M_p +
                               *(long *)(local_238[0].FileName._M_dataplus._M_p + -0x18)) & 5) == 0)
                   && (BVar9 = cmsys::FStream::ReadBOM((istream *)local_238), BVar9 < BOM_UTF16BE))
                {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_268,&local_390);
                  cmsys::SystemTools::GetFilenamePath(&local_320,&local_390);
                  Scan(this,(istream *)local_238,&local_320,&local_390);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_320._M_dataplus._M_p != &local_320.field_2) {
                    operator_delete(local_320._M_dataplus._M_p,
                                    local_320.field_2._M_allocated_capacity + 1);
                  }
                }
                std::ifstream::~ifstream(local_238);
              }
              else {
                *(undefined1 *)&iVar14._M_node[2]._M_right = 1;
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)local_268,&local_390);
                pvVar5 = (value_type *)iVar14._M_node[2]._M_parent;
                for (__x = *(value_type **)(iVar14._M_node + 2); __x != pvVar5; __x = __x + 1) {
                  iVar13 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_328,&__x->FileName);
                  if (iVar13._M_node == local_270) {
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>(local_328,&__x->FileName);
                    std::
                    deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
                    push_back(&local_2b8->c,__x);
                  }
                }
              }
            }
            local_394 = local_394 + -1;
            bVar8 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,
                            CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                                     local_390.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          }
        } while (bVar8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_300);
        bVar8 = false;
      }
      else {
        p_Var11 = *(_Base_ptr *)(cVar10._M_node + 2);
        p_Var2 = cVar10._M_node[2]._M_parent;
        local_238[0].FileName._M_dataplus._M_p = local_268;
        if (p_Var11 != p_Var2) {
          do {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::
            _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_268,(_Base_ptr)(local_268 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var11,
                       (_Alloc_node *)local_238);
            p_Var11 = p_Var11 + 1;
          } while (p_Var11 != p_Var2);
        }
LAB_0055ff6a:
        cmLocalUnixMakefileGenerator3::ConvertToMakefilePath
                  (&local_238[0].FileName,(this->super_cmDepends).LocalGenerator,&local_2b0);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_2c0,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
        local_368._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)&local_368,1);
        if (local_240 != 0) {
          pcVar7 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                   super_cmLocalGenerator.GlobalGenerator;
          cVar1 = *(char *)((long)&pcVar7[1].FindMakeProgramFile._M_string_length + 4);
          if (cVar1 == '\x01') {
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (local_370,local_238[0].FileName._M_dataplus._M_p,
                                 local_238[0].FileName._M_string_length);
            local_368._M_dataplus._M_p._0_1_ = 0x3a;
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)&local_368,1);
          }
          if (local_250 != (_Rb_tree_node_base *)(local_268 + 8)) {
            p_Var17 = local_250;
            do {
              this_01 = (this->super_cmDepends).LocalGenerator;
              cmOutputConverter::MaybeRelativeToTopBinDir
                        ((string *)local_300,
                         &(this_01->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                          super_cmOutputConverter,(string *)(p_Var17 + 1));
              cmLocalUnixMakefileGenerator3::ConvertToMakefilePath
                        (&local_368,this_01,(string *)local_300);
              if ((undefined1 *)CONCAT71(local_300._1_7_,local_300[0]) != local_300 + 0x10) {
                operator_delete((undefined1 *)CONCAT71(local_300._1_7_,local_300[0]),
                                (ulong)(local_300._16_8_ + 1));
              }
              if (cVar1 == '\0') {
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (local_370,local_238[0].FileName._M_dataplus._M_p,
                                     local_238[0].FileName._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,": ",2);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar16,local_368._M_dataplus._M_p,local_368._M_string_length);
                local_300[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                )0xa;
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)local_300,1);
              }
              else {
                local_300[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                )0x20;
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (local_370,(char *)local_300,1);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar16,(char *)pcVar7[1].MakeSilentFlag.field_2.
                                                     _M_allocated_capacity,
                                     *(long *)((long)&pcVar7[1].MakeSilentFlag.field_2 + 8));
                local_300[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                )0x20;
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar16,(char *)local_300,1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,local_368._M_dataplus._M_p,local_368._M_string_length);
              }
              local_300[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              )0x20;
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  (local_2c0,(char *)local_300,1);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar16,*(char **)(p_Var17 + 1),(long)p_Var17[1]._M_parent);
              local_300[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              )0xa;
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)local_300,1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368._M_dataplus._M_p != &local_368.field_2) {
                operator_delete(local_368._M_dataplus._M_p,
                                local_368.field_2._M_allocated_capacity + 1);
              }
              p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
            } while (p_Var17 != (_Rb_tree_node_base *)(local_268 + 8));
          }
          local_368._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(local_370,(char *)&local_368,1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
          operator_delete(local_238[0].FileName._M_dataplus._M_p,
                          local_238[0].FileName.field_2._M_allocated_capacity + 1);
        }
        bVar8 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_268);
      return bVar8;
    }
    local_238[0].FileName._M_dataplus._M_p = (pointer)&local_238[0].FileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"Cannot scan dependencies without an object file.","");
    cmSystemTools::Error(&local_238[0].FileName);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
    operator_delete(local_238[0].FileName._M_dataplus._M_p,
                    local_238[0].FileName.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmDependsC::WriteDependencies(const std::set<std::string>& sources,
                                   const std::string& obj,
                                   std::ostream& makeDepends,
                                   std::ostream& internalDepends)
{
  // Make sure this is a scanning instance.
  if (sources.empty() || sources.begin()->empty()) {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
  }
  if (obj.empty()) {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
  }

  std::set<std::string> dependencies;
  bool haveDeps = false;

  // Compute a path to the object file to write to the internal depend file.
  // Any existing content of the internal depend file has already been
  // loaded in ValidDeps with this path as a key.
  std::string obj_i = this->LocalGenerator->MaybeRelativeToTopBinDir(obj);

  if (this->ValidDeps != nullptr) {
    auto const tmpIt = this->ValidDeps->find(obj_i);
    if (tmpIt != this->ValidDeps->end()) {
      dependencies.insert(tmpIt->second.begin(), tmpIt->second.end());
      haveDeps = true;
    }
  }

  if (!haveDeps) {
    // Walk the dependency graph starting with the source file.
    int srcFiles = static_cast<int>(sources.size());
    this->Encountered.clear();

    for (std::string const& src : sources) {
      UnscannedEntry root;
      root.FileName = src;
      this->Unscanned.push(root);
      this->Encountered.insert(src);
    }

    std::set<std::string> scanned;
    while (!this->Unscanned.empty()) {
      // Get the next file to scan.
      UnscannedEntry current = this->Unscanned.front();
      this->Unscanned.pop();

      // If not a full path, find the file in the include path.
      std::string fullName;
      if ((srcFiles > 0) || cmSystemTools::FileIsFullPath(current.FileName)) {
        if (cmSystemTools::FileExists(current.FileName, true)) {
          fullName = current.FileName;
        }
      } else if (!current.QuotedLocation.empty() &&
                 cmSystemTools::FileExists(current.QuotedLocation, true)) {
        // The include statement producing this entry was a double-quote
        // include and the included file is present in the directory of
        // the source containing the include statement.
        fullName = current.QuotedLocation;
      } else {
        auto headerLocationIt =
          this->HeaderLocationCache.find(current.FileName);
        if (headerLocationIt != this->HeaderLocationCache.end()) {
          fullName = headerLocationIt->second;
        } else {
          for (std::string const& iPath : this->IncludePath) {
            // Construct the name of the file as if it were in the current
            // include directory.  Avoid using a leading "./".
            std::string tmpPath =
              cmSystemTools::CollapseFullPath(current.FileName, iPath);

            // Look for the file in this location.
            if (cmSystemTools::FileExists(tmpPath, true)) {
              fullName = tmpPath;
              this->HeaderLocationCache[current.FileName] = std::move(tmpPath);
              break;
            }
          }
        }
      }

      // Complain if the file cannot be found and matches the complain
      // regex.
      if (fullName.empty() &&
          this->IncludeRegexComplain.find(current.FileName)) {
        cmSystemTools::Error("Cannot find file \"" + current.FileName + "\".");
        return false;
      }

      // Scan the file if it was found and has not been scanned already.
      if (!fullName.empty() && (scanned.find(fullName) == scanned.end())) {
        // Record scanned files.
        scanned.insert(fullName);

        // Check whether this file is already in the cache
        auto fileIt = this->FileCache.find(fullName);
        if (fileIt != this->FileCache.end()) {
          fileIt->second.Used = true;
          dependencies.insert(fullName);
          for (UnscannedEntry const& inc : fileIt->second.UnscannedEntries) {
            if (this->Encountered.find(inc.FileName) ==
                this->Encountered.end()) {
              this->Encountered.insert(inc.FileName);
              this->Unscanned.push(inc);
            }
          }
        } else {

          // Try to scan the file.  Just leave it out if we cannot find
          // it.
          cmsys::ifstream fin(fullName.c_str());
          if (fin) {
            cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
            if (bom == cmsys::FStream::BOM_None ||
                bom == cmsys::FStream::BOM_UTF8) {
              // Add this file as a dependency.
              dependencies.insert(fullName);

              // Scan this file for new dependencies.  Pass the directory
              // containing the file to handle double-quote includes.
              std::string dir = cmSystemTools::GetFilenamePath(fullName);
              this->Scan(fin, dir, fullName);
            } else {
              // Skip file with encoding we do not implement.
            }
          }
        }
      }

      srcFiles--;
    }
  }

  // Write the dependencies to the output stream.  Makefile rules
  // written by the original local generator for this directory
  // convert the dependencies to paths relative to the home output
  // directory.  We must do the same here.
  std::string obj_m = this->LocalGenerator->ConvertToMakefilePath(obj_i);
  internalDepends << obj_i << '\n';
  if (!dependencies.empty()) {
    const auto& lineContinue = static_cast<cmGlobalUnixMakefileGenerator3*>(
                                 this->LocalGenerator->GetGlobalGenerator())
                                 ->LineContinueDirective;
    bool supportLongLineDepend = static_cast<cmGlobalUnixMakefileGenerator3*>(
                                   this->LocalGenerator->GetGlobalGenerator())
                                   ->SupportsLongLineDependencies();
    if (supportLongLineDepend) {
      makeDepends << obj_m << ':';
    }
    for (std::string const& dep : dependencies) {
      std::string dependee = this->LocalGenerator->ConvertToMakefilePath(
        this->LocalGenerator->MaybeRelativeToTopBinDir(dep));
      if (supportLongLineDepend) {
        makeDepends << ' ' << lineContinue << ' ' << dependee;
      } else {
        makeDepends << obj_m << ": " << dependee << '\n';
      }
      internalDepends << ' ' << dep << '\n';
    }
    makeDepends << '\n';
  }

  return true;
}